

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O1

void __thiscall Imf_3_4::Header::sanityCheck(Header *this,bool isTiled,bool isMultipartFile)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float fVar4;
  uint uVar5;
  uint uVar6;
  pointer pcVar7;
  bool bVar8;
  bool bVar9;
  int iVar10;
  Attribute *pAVar11;
  Attribute *pAVar12;
  TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pTVar13;
  TypedAttribute<Imf_3_4::TileDescription> *pTVar14;
  ConstIterator CVar15;
  const_iterator cVar16;
  ostream *poVar17;
  ArgExc *pAVar18;
  ChannelList *this_00;
  int maxImageHeight;
  int maxImageWidth;
  int maxTileHeight;
  int maxTileWidth;
  stringstream _iex_throw_s;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  pAVar11 = operator[](this,"displayWindow");
  if (((((*(int *)&pAVar11[2]._vptr_Attribute < *(int *)&pAVar11[1]._vptr_Attribute) ||
        (iVar10 = *(int *)((long)&pAVar11[2]._vptr_Attribute + 4), 0x3ffffffe < iVar10)) ||
       (0x3ffffffe < *(int *)&pAVar11[2]._vptr_Attribute)) ||
      ((iVar1 = *(int *)((long)&pAVar11[1]._vptr_Attribute + 4), iVar1 < -0x3ffffffe ||
       (*(int *)&pAVar11[1]._vptr_Attribute < -0x3ffffffe)))) || (iVar10 < iVar1)) {
    pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar18,"Invalid display window in image header.");
LAB_0017ca2d:
    __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pAVar11 = operator[](this,"dataWindow");
  iVar10 = *(int *)&pAVar11[1]._vptr_Attribute;
  iVar1 = *(int *)&pAVar11[2]._vptr_Attribute;
  if (((iVar1 < iVar10) ||
      (iVar2 = *(int *)((long)&pAVar11[2]._vptr_Attribute + 4), 0x3ffffffe < iVar2)) ||
     ((0x3ffffffe < iVar1 ||
      (((iVar3 = *(int *)((long)&pAVar11[1]._vptr_Attribute + 4), iVar3 < -0x3ffffffe ||
        (iVar10 < -0x3ffffffe)) || (iVar2 < iVar3)))))) {
    pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar18,"Invalid data window in image header.");
    goto LAB_0017ca2d;
  }
  local_1e4 = 0;
  exr_get_default_maximum_image_size(&local_1e4);
  if (local_1e4 <= iVar1 - iVar10 && 0 < local_1e4) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"The width of the data window exceeds the maximum width of ",0x3a);
    poVar17 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,local_1e4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar17,"pixels.",7);
    pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar18,local_1b8);
    __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  pAVar12 = operator[](this,"pixelAspectRatio");
  fVar4 = *(float *)&pAVar12[1]._vptr_Attribute;
  if (((1e+06 < fVar4) || (fVar4 < 1e-06)) || (0x7effffff < (int)ABS(fVar4) - 0x800000U)) {
    pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar18,"Invalid pixel aspect ratio in image header.");
    goto LAB_0017ca2d;
  }
  pAVar12 = operator[](this,"screenWindowWidth");
  if (*(float *)&pAVar12[1]._vptr_Attribute <= 0.0 && *(float *)&pAVar12[1]._vptr_Attribute != 0.0)
  {
    pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(pAVar18,"Invalid screen window width in image header.");
    goto LAB_0017ca2d;
  }
  if (isMultipartFile) {
    pTVar13 = findTypedAttribute<Imf_3_4::TypedAttribute<std::__cxx11::string>>(this,"name");
    if (pTVar13 ==
        (TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x0) {
      pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar18,"Headers in a multipart file should have name attribute.");
      goto LAB_0017ca2d;
    }
    pTVar13 = findTypedAttribute<Imf_3_4::TypedAttribute<std::__cxx11::string>>(this,"type");
    if (pTVar13 ==
        (TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)0x0) {
      pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar18,"Headers in a multipart file should have type attribute.");
      goto LAB_0017ca2d;
    }
  }
  pTVar13 = findTypedAttribute<Imf_3_4::TypedAttribute<std::__cxx11::string>>(this,"type");
  if (pTVar13 ==
      (TypedAttribute<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *)0x0) {
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"");
  }
  else {
    pTVar13 = typedAttribute<Imf_3_4::TypedAttribute<std::__cxx11::string>>(this,"type");
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    pcVar7 = (pTVar13->_value)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1d8,pcVar7,pcVar7 + (pTVar13->_value)._M_string_length);
  }
  iVar10 = std::__cxx11::string::compare((char *)&local_1d8);
  if ((iVar10 == 0) || (bVar8 = isSupportedType(&local_1d8), bVar8)) {
    bVar8 = isDeepData(&local_1d8);
    pAVar12 = operator[](this,"lineOrder");
    uVar5 = *(uint *)&pAVar12[1]._vptr_Attribute;
    if (isTiled) {
      pTVar14 = findTypedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::TileDescription>>(this,"tiles");
      if (pTVar14 == (TypedAttribute<Imf_3_4::TileDescription> *)0x0) {
        pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar18,"Tiled image has no tile description attribute.");
        goto LAB_0017cc09;
      }
      pTVar14 = typedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::TileDescription>>(this,"tiles");
      uVar6 = (pTVar14->_value).xSize;
      if (((uVar6 == 0) || ((int)uVar6 < 0)) || ((int)(pTVar14->_value).ySize < 1)) {
        pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar18,"Invalid tile size in image header.");
        __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      local_1dc = 0;
      local_1e0 = 0;
      exr_get_default_maximum_tile_size();
      if ((0 < local_1dc) && (local_1dc < (int)(pTVar14->_value).xSize)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"The width of the tiles exceeds the maximum width of ",0x34);
        poVar17 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,local_1dc);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"pixels.",7);
        pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar18,local_1b8);
        __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      if ((0 < local_1e0) && (local_1e0 < (int)(pTVar14->_value).ySize)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (local_1a8,"The width of the tiles exceeds the maximum width of ",0x34);
        poVar17 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,local_1e0);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"pixels.",7);
        pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar18,local_1b8);
        __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      if (RIPMAP_LEVELS < (pTVar14->_value).mode) {
        pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar18,"Invalid level mode in image header.");
LAB_0017cbd7:
        __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      if (ROUND_UP < (pTVar14->_value).roundingMode) {
        pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar18,"Invalid level rounding mode in image header.");
        goto LAB_0017cbd7;
      }
      if (2 < uVar5) {
        pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar18,"Invalid line order in image header.");
        goto LAB_0017cbd7;
      }
      getTiledChunkOffsetTableSize(this);
    }
    else if (1 < uVar5) {
      pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar18,"Invalid line order in image header.");
      goto LAB_0017cc09;
    }
    pAVar12 = operator[](this,"compression");
    bVar9 = isValidCompression(*(int *)&pAVar12[1]._vptr_Attribute);
    if (!bVar9) {
      pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar18,"Unknown compression type in image header.");
LAB_0017cc09:
      __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    if (bVar8) {
      pAVar12 = operator[](this,"compression");
      bVar9 = isValidDeepCompression(*(Compression *)&pAVar12[1]._vptr_Attribute);
      if (!bVar9) {
        pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar18,"Compression type in header not valid for deep data");
        goto LAB_0017cc09;
      }
    }
    pAVar12 = operator[](this,"channels");
    this_00 = (ChannelList *)(pAVar12 + 1);
    CVar15 = ChannelList::begin(this_00);
    cVar16._M_node = (_Base_ptr)ChannelList::end(this_00);
    if (CVar15._i._M_node == (const_iterator)cVar16._M_node) {
      iex_debugTrap();
      std::__cxx11::stringstream::stringstream(local_1b8);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,"Missing or empty channel list in header",0x27);
      pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_4::ArgExc::ArgExc(pAVar18,local_1b8);
      __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
    }
    if (bVar8 || isTiled) {
      for (cVar16._M_node = (_Base_ptr)ChannelList::begin(this_00);
          CVar15 = ChannelList::end(this_00), (const_iterator)cVar16._M_node != CVar15._i._M_node;
          cVar16._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar16._M_node)) {
        if (2 < cVar16._M_node[9]._M_color) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Pixel type of \"",0xf);
          poVar17 = std::operator<<(local_1a8,(char *)(cVar16._M_node + 1));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar17,"\" image channel is invalid.",0x1b);
          pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar18,local_1b8);
          __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        if (*(int *)&cVar16._M_node[9].field_0x4 != 1) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"The x subsampling factor for the \"",0x22);
          poVar17 = std::operator<<(local_1a8,(char *)(cVar16._M_node + 1));
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\" channel is not 1.",0x13);
          pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar18,local_1b8);
          __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        if (*(int *)&cVar16._M_node[9]._M_parent != 1) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"The y subsampling factor for the \"",0x22);
          poVar17 = std::operator<<(local_1a8,(char *)(cVar16._M_node + 1));
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\" channel is not 1.",0x13);
          pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar18,local_1b8);
          __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
      }
    }
    else {
      for (cVar16._M_node = (_Base_ptr)ChannelList::begin(this_00);
          CVar15 = ChannelList::end(this_00), (const_iterator)cVar16._M_node != CVar15._i._M_node;
          cVar16._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar16._M_node)) {
        if (2 < cVar16._M_node[9]._M_color) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Pixel type of \"",0xf);
          poVar17 = std::operator<<(local_1a8,(char *)(cVar16._M_node + 1));
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar17,"\" image channel is invalid.",0x1b);
          pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar18,local_1b8);
          __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        iVar10 = *(int *)&cVar16._M_node[9].field_0x4;
        if (iVar10 < 1) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"The x subsampling factor for the \"",0x22);
          poVar17 = std::operator<<(local_1a8,(char *)(cVar16._M_node + 1));
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\" channel is invalid.",0x15);
          pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar18,local_1b8);
          __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        iVar1 = *(int *)&cVar16._M_node[9]._M_parent;
        if (iVar1 < 1) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"The y subsampling factor for the \"",0x22);
          poVar17 = std::operator<<(local_1a8,(char *)(cVar16._M_node + 1));
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\" channel is invalid.",0x15);
          pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar18,local_1b8);
          __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        if (*(int *)&pAVar11[1]._vptr_Attribute % iVar10 != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,
                     "The minimum x coordinate of the image\'s data window is not a multiple of the x subsampling factor of the \""
                     ,0x6a);
          poVar17 = std::operator<<(local_1a8,(char *)(cVar16._M_node + 1));
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\" channel.",10);
          pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar18,local_1b8);
          __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        iVar2 = *(int *)((long)&pAVar11[1]._vptr_Attribute + 4);
        if (iVar2 % iVar1 != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,
                     "The minimum y coordinate of the image\'s data window is not a multiple of the y subsampling factor of the \""
                     ,0x6a);
          poVar17 = std::operator<<(local_1a8,(char *)(cVar16._M_node + 1));
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\" channel.",10);
          pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar18,local_1b8);
          __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        if (((*(int *)&pAVar11[2]._vptr_Attribute - *(int *)&pAVar11[1]._vptr_Attribute) + 1) %
            iVar10 != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,
                     "Number of pixels per row in the image\'s data window is not a multiple of the x subsampling factor of the \""
                     ,0x6a);
          poVar17 = std::operator<<(local_1a8,(char *)(cVar16._M_node + 1));
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\" channel.",10);
          pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar18,local_1b8);
          __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
        if (((*(int *)((long)&pAVar11[2]._vptr_Attribute + 4) - iVar2) + 1) % iVar1 != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream(local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,
                     "Number of pixels per column in the image\'s data window is not a multiple of the y subsampling factor of the \""
                     ,0x6d);
          poVar17 = std::operator<<(local_1a8,(char *)(cVar16._M_node + 1));
          std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\" channel.",10);
          pAVar18 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar18,local_1b8);
          __cxa_throw(pAVar18,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void
Header::sanityCheck (bool isTiled, bool isMultipartFile) const
{
    //
    // The display window and the data window must each
    // contain at least one pixel.  In addition, the
    // coordinates of the window corners must be small
    // enough to keep expressions like max-min+1 or
    // max+min from overflowing.
    //

    const Box2i& displayWindow = this->displayWindow ();

    if (displayWindow.min.x > displayWindow.max.x ||
        displayWindow.min.y > displayWindow.max.y ||
        displayWindow.min.x <= -(INT_MAX / 2) ||
        displayWindow.min.y <= -(INT_MAX / 2) ||
        displayWindow.max.x >= (INT_MAX / 2) ||
        displayWindow.max.y >= (INT_MAX / 2))
    {
        throw IEX_NAMESPACE::ArgExc ("Invalid display window in image header.");
    }

    const Box2i& dataWindow = this->dataWindow ();

    if (dataWindow.min.x > dataWindow.max.x ||
        dataWindow.min.y > dataWindow.max.y ||
        dataWindow.min.x <= -(INT_MAX / 2) ||
        dataWindow.min.y <= -(INT_MAX / 2) ||
        dataWindow.max.x >= (INT_MAX / 2) || dataWindow.max.y >= (INT_MAX / 2))
    {
        throw IEX_NAMESPACE::ArgExc ("Invalid data window in image header.");
    }

    int w = (dataWindow.max.x - dataWindow.min.x + 1);

    int maxImageWidth = 0, maxImageHeight = 0;
    // TODO: this really should be accessed via the context but
    // we don't have that fully wired through just yet, so continue
    // to use the default as the older C++ code has done
    exr_get_default_maximum_image_size (&maxImageWidth, &maxImageHeight);

    if (maxImageWidth > 0 && maxImageWidth < w)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "The width of the data window exceeds the "
            "maximum width of "
                << maxImageWidth << "pixels.");
    }

    int h = (dataWindow.max.y - dataWindow.min.y + 1);
    if (maxImageHeight > 0 && maxImageHeight < h)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "The height of the data window exceeds the "
            "maximum height of "
                << maxImageHeight << "pixels.");
    }

    // chunk table must be smaller than the maximum image area
    // (only reachable for unknown types or damaged files: will have thrown earlier
    //  for regular image types)
    if (maxImageHeight > 0 && maxImageWidth > 0 && hasChunkCount () &&
        static_cast<uint64_t> (chunkCount ()) >
            uint64_t (maxImageWidth) * uint64_t (maxImageHeight))
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "chunkCount exceeds maximum area of "
                << uint64_t (maxImageWidth) * uint64_t (maxImageHeight)
                << " pixels.");
    }

    //
    // The pixel aspect ratio must be greater than 0.
    // In applications, numbers like the display or the
    // data window dimensions are likely to be multiplied
    // or divided by the pixel aspect ratio; to avoid
    // arithmetic exceptions, we limit the pixel aspect
    // ratio to a range that is smaller than theoretically
    // possible (real aspect ratios are likely to be close
    // to 1.0 anyway).
    //

    float pixelAspectRatio = this->pixelAspectRatio ();

    const float MIN_PIXEL_ASPECT_RATIO = 1e-6f;
    const float MAX_PIXEL_ASPECT_RATIO = 1e+6f;

    if (!std::isnormal (pixelAspectRatio) ||
        pixelAspectRatio < MIN_PIXEL_ASPECT_RATIO ||
        pixelAspectRatio > MAX_PIXEL_ASPECT_RATIO)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Invalid pixel aspect ratio in image header.");
    }

    //
    // The screen window width must not be less than 0.
    // The size of the screen window can vary over a wide
    // range (fish-eye lens to astronomical telescope),
    // so we can't limit the screen window width to a
    // small range.
    //

    float screenWindowWidth = this->screenWindowWidth ();

    if (screenWindowWidth < 0)
        throw IEX_NAMESPACE::ArgExc (
            "Invalid screen window width in image header.");

    //
    // If the file has multiple parts, verify that each header has attribute
    // name and type.
    // (TODO) We may want to check more stuff here.
    //

    if (isMultipartFile)
    {
        if (!hasName ())
        {
            throw IEX_NAMESPACE::ArgExc ("Headers in a multipart file should"
                                         " have name attribute.");
        }

        if (!hasType ())
        {
            throw IEX_NAMESPACE::ArgExc ("Headers in a multipart file should"
                                         " have type attribute.");
        }
    }

    const std::string& part_type = hasType () ? type () : "";

    if (part_type != "" && !isSupportedType (part_type))
    {
        //
        // skip remaining sanity checks with unsupported types - they may not hold
        //
        return;
    }

    bool isDeep = isDeepData (part_type);

    //
    // If the file is tiled, verify that the tile description has reasonable
    // values and check to see if the lineOrder is one of the predefined 3.
    // If the file is not tiled, then the lineOrder can only be INCREASING_Y
    // or DECREASING_Y.
    //

    LineOrder lineOrder = this->lineOrder ();

    if (isTiled)
    {
        if (!hasTileDescription ())
        {
            throw IEX_NAMESPACE::ArgExc ("Tiled image has no tile "
                                         "description attribute.");
        }

        const TileDescription& tileDesc = tileDescription ();

        if (tileDesc.xSize <= 0 || tileDesc.ySize <= 0 ||
            tileDesc.xSize > INT_MAX || tileDesc.ySize > INT_MAX)
            throw IEX_NAMESPACE::ArgExc ("Invalid tile size in image header.");

        int maxTileWidth = 0, maxTileHeight = 0;
        // TODO: this really should be accessed via the context but
        // we don't have that fully wired through just yet, so continue
        // to use the default as the older C++ code has done
        exr_get_default_maximum_tile_size (&maxTileWidth, &maxTileHeight);

        if (maxTileWidth > 0 && maxTileWidth < int (tileDesc.xSize))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "The width of the tiles exceeds the maximum "
                "width of "
                    << maxTileWidth << "pixels.");
        }

        if (maxTileHeight > 0 && maxTileHeight < int (tileDesc.ySize))
        {
            THROW (
                IEX_NAMESPACE::ArgExc,
                "The width of the tiles exceeds the maximum "
                "width of "
                    << maxTileHeight << "pixels.");
        }

        if (tileDesc.mode != ONE_LEVEL && tileDesc.mode != MIPMAP_LEVELS &&
            tileDesc.mode != RIPMAP_LEVELS)
            throw IEX_NAMESPACE::ArgExc ("Invalid level mode in image header.");

        if (tileDesc.roundingMode != ROUND_UP &&
            tileDesc.roundingMode != ROUND_DOWN)
            throw IEX_NAMESPACE::ArgExc (
                "Invalid level rounding mode in image header.");

        if (lineOrder != INCREASING_Y && lineOrder != DECREASING_Y &&
            lineOrder != RANDOM_Y)
            throw IEX_NAMESPACE::ArgExc ("Invalid line order in image header.");

        // computes size of chunk offset table. Throws an exception if this exceeds
        // the maximum allowable size
        getTiledChunkOffsetTableSize (*this);
    }
    else
    {
        if (lineOrder != INCREASING_Y && lineOrder != DECREASING_Y)
            throw IEX_NAMESPACE::ArgExc ("Invalid line order in image header.");
    }

    //
    // The compression method must be one of the predefined values.
    //

    if (!isValidCompression (this->compression ()))
        throw IEX_NAMESPACE::ArgExc (
            "Unknown compression type in image header.");

    if (isDeep)
    {
        if (!isValidDeepCompression (this->compression ()))
            throw IEX_NAMESPACE::ArgExc (
                "Compression type in header not valid for deep data");
    }

    //
    // Check the channel list:
    //
    // If the file is tiled then for each channel, the type must be one of the
    // predefined values, and the x and y sampling must both be 1.
    //
    // x and y sampling must currently also be 1 for deep scanline images
    //
    // If the file is not tiled then for each channel, the type must be one
    // of the predefined values, the x and y coordinates of the data window's
    // upper left corner must be divisible by the x and y subsampling factors,
    // and the width and height of the data window must be divisible by the
    // x and y subsampling factors.
    //

    const ChannelList& channels = this->channels ();

    if (channels.begin () == channels.end ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc, "Missing or empty channel list in header");
    }

    if (isTiled || isDeep)
    {
        for (ChannelList::ConstIterator i = channels.begin ();
             i != channels.end ();
             ++i)
        {
            if (i.channel ().type != OPENEXR_IMF_INTERNAL_NAMESPACE::UINT &&
                i.channel ().type != OPENEXR_IMF_INTERNAL_NAMESPACE::HALF &&
                i.channel ().type != OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "Pixel type of \"" << i.name ()
                                       << "\" "
                                          "image channel is invalid.");
            }

            if (i.channel ().xSampling != 1)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "The x subsampling factor for the "
                    "\"" << i.name ()
                         << "\" channel "
                            "is not 1.");
            }

            if (i.channel ().ySampling != 1)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "The y subsampling factor for the "
                    "\"" << i.name ()
                         << "\" channel "
                            "is not 1.");
            }
        }
    }
    else
    {
        for (ChannelList::ConstIterator i = channels.begin ();
             i != channels.end ();
             ++i)
        {
            if (i.channel ().type != OPENEXR_IMF_INTERNAL_NAMESPACE::UINT &&
                i.channel ().type != OPENEXR_IMF_INTERNAL_NAMESPACE::HALF &&
                i.channel ().type != OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "Pixel type of \"" << i.name ()
                                       << "\" "
                                          "image channel is invalid.");
            }

            if (i.channel ().xSampling < 1)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "The x subsampling factor for the "
                    "\"" << i.name ()
                         << "\" channel "
                            "is invalid.");
            }

            if (i.channel ().ySampling < 1)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "The y subsampling factor for the "
                    "\"" << i.name ()
                         << "\" channel "
                            "is invalid.");
            }

            if (dataWindow.min.x % i.channel ().xSampling)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "The minimum x coordinate of the "
                    "image's data window is not a multiple "
                    "of the x subsampling factor of "
                    "the \""
                        << i.name () << "\" channel.");
            }

            if (dataWindow.min.y % i.channel ().ySampling)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "The minimum y coordinate of the "
                    "image's data window is not a multiple "
                    "of the y subsampling factor of "
                    "the \""
                        << i.name () << "\" channel.");
            }

            if ((dataWindow.max.x - dataWindow.min.x + 1) %
                i.channel ().xSampling)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "Number of pixels per row in the "
                    "image's data window is not a multiple "
                    "of the x subsampling factor of "
                    "the \""
                        << i.name () << "\" channel.");
            }

            if ((dataWindow.max.y - dataWindow.min.y + 1) %
                i.channel ().ySampling)
            {
                THROW (
                    IEX_NAMESPACE::ArgExc,
                    "Number of pixels per column in the "
                    "image's data window is not a multiple "
                    "of the y subsampling factor of "
                    "the \""
                        << i.name () << "\" channel.");
            }
        }
    }
}